

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

Oop __thiscall
Lodtalk::MethodSemanticAnalysis::visitBlockExpression
          (MethodSemanticAnalysis *this,BlockExpression *node)

{
  pointer psVar1;
  pointer ppAVar2;
  pointer ppAVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  undefined4 extraout_var;
  Oop OVar6;
  vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_> *pvVar7;
  SequenceNode *pSVar8;
  long lVar9;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar10;
  anon_union_8_4_0eb573b0_for_Oop_0 *this_01;
  __shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2> *p_Var11;
  TemporalVariableLookupPtr res;
  shared_ptr<Lodtalk::LocalScope> argumentScope;
  TemporalVariableLookupPtr res_1;
  anon_union_8_4_0eb573b0_for_Oop_0 local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2> *local_98;
  BlockExpression *local_90;
  anon_union_8_4_0eb573b0_for_Oop_0 local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  pointer local_78;
  __shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2> *local_70;
  ArgumentList *local_68;
  anon_union_8_4_0eb573b0_for_Oop_0 local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  __shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2> local_40;
  ArgumentList *this_00;
  
  iVar5 = (*(node->super_FunctionalNode).super_Node._vptr_Node[8])(node);
  this_00 = (ArgumentList *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*(node->super_FunctionalNode).super_Node._vptr_Node[9])(node);
  if ((char)iVar5 == '\0') {
    p_Var11 = (__shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2> *)
              this->localContext;
    this->localContext = (Node *)node;
    local_88 = (anon_union_8_4_0eb573b0_for_Oop_0)
               (this->localVariables).
               super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    _Stack_80._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (this->localVariables).
         super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_78 = (this->localVariables).
               super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->localVariables).
    super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this->localVariables).
    super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->localVariables).
    super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (this_00 != (ArgumentList *)0x0) {
      local_90 = node;
      pvVar7 = AST::ArgumentList::getArguments(this_00);
      ppAVar2 = (pvVar7->
                super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      ppAVar3 = (pvVar7->
                super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_70 = &(this->super_ScopedInterpreter).currentScope.
                  super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>;
      local_98 = p_Var11;
      local_68 = this_00;
      std::make_shared<Lodtalk::LocalScope,std::shared_ptr<Lodtalk::EvaluationScope>&>
                ((shared_ptr<Lodtalk::EvaluationScope> *)&local_a8);
      for (lVar9 = 0; aVar10 = local_a8, (long)ppAVar2 - (long)ppAVar3 >> 3 != lVar9;
          lVar9 = lVar9 + 1) {
        OVar6 = AST::Argument::getSymbolOop
                          ((pvVar7->
                           super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                           )._M_impl.super__Vector_impl_data._M_start[lVar9]);
        this_01 = &local_60;
        LocalScope::addArgument((LocalScope *)&local_60,(Oop)aVar10,(Node *)OVar6.field_0);
        if (local_60.pointer == (uint8_t *)0x0) goto LAB_00143e61;
        std::
        vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
        ::push_back(&this->localVariables,(value_type *)&local_60);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
      }
      std::__shared_ptr<Lodtalk::EvaluationScope,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<Lodtalk::LocalScope,void>
                ((__shared_ptr<Lodtalk::EvaluationScope,(__gnu_cxx::_Lock_policy)2> *)&local_50,
                 (__shared_ptr<Lodtalk::LocalScope,_(__gnu_cxx::_Lock_policy)2> *)&local_a8);
      std::__shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>::operator=
                (local_70,&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
      node = local_90;
      p_Var11 = local_98;
      this_00 = local_68;
    }
    pSVar8 = AST::BlockExpression::getBody(node);
    (*(pSVar8->super_Node)._vptr_Node[2])(pSVar8,this);
    if (this_00 != (ArgumentList *)0x0) {
      ScopedInterpreter::popScope(&this->super_ScopedInterpreter);
    }
    AST::FunctionalNode::setLocalVariables(&node->super_FunctionalNode,&this->localVariables);
    this->localContext = (Node *)p_Var11;
    psVar1 = (this->localVariables).
             super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    aVar10 = (anon_union_8_4_0eb573b0_for_Oop_0)
             (this->localVariables).
             super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (this->localVariables).
             super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->localVariables).
    super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88;
    (this->localVariables).
    super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_80._M_pi;
    (this->localVariables).
    super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_78;
    local_88 = aVar10;
    _Stack_80._M_pi = p_Var4;
    local_78 = psVar1;
    std::
    vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ::~vector((vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
               *)&local_88);
  }
  else if (this_00 == (ArgumentList *)0x0) {
    pSVar8 = AST::BlockExpression::getBody(node);
    (*(pSVar8->super_Node)._vptr_Node[2])(pSVar8,this);
  }
  else {
    local_90 = (BlockExpression *)AST::ArgumentList::getArguments(this_00);
    psVar1 = (local_90->super_FunctionalNode).localVariables.
             super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppAVar2 = (((_Vector_impl *)&(local_90->super_FunctionalNode).super_Node)->
              super__Vector_impl_data)._M_start;
    local_98 = &(this->super_ScopedInterpreter).currentScope.
                super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>;
    std::make_shared<Lodtalk::LocalScope,std::shared_ptr<Lodtalk::EvaluationScope>&>
              ((shared_ptr<Lodtalk::EvaluationScope> *)&local_88);
    for (lVar9 = 0; aVar10 = local_88, (long)psVar1 - (long)ppAVar2 >> 3 != lVar9; lVar9 = lVar9 + 1
        ) {
      OVar6 = AST::Argument::getSymbolOop
                        ((((_Vector_impl *)&(local_90->super_FunctionalNode).super_Node)->
                         super__Vector_impl_data)._M_start[lVar9]);
      this_01 = &local_a8;
      LocalScope::addArgument((LocalScope *)&local_a8,(Oop)aVar10,(Node *)OVar6.field_0);
      if (local_a8.pointer == (uint8_t *)0x0) {
LAB_00143e61:
        AbstractASTVisitor::error
                  ((AbstractASTVisitor *)this_01,(Node *)aVar10.header,
                   "the argument has the same name as another argument.");
      }
      AST::BlockExpression::addInlineArgument(node,(TemporalVariableLookupPtr *)&local_a8);
      std::
      vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
      ::push_back(&this->localVariables,(value_type *)&local_a8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
    }
    std::__shared_ptr<Lodtalk::EvaluationScope,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Lodtalk::LocalScope,void>
              ((__shared_ptr<Lodtalk::EvaluationScope,(__gnu_cxx::_Lock_policy)2> *)&local_40,
               (__shared_ptr<Lodtalk::LocalScope,_(__gnu_cxx::_Lock_policy)2> *)&local_88);
    std::__shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>::operator=
              (local_98,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_80);
    pSVar8 = AST::BlockExpression::getBody(node);
    (*(pSVar8->super_Node)._vptr_Node[2])(pSVar8,this);
    ScopedInterpreter::popScope(&this->super_ScopedInterpreter);
  }
  return (Oop)&NilObject;
}

Assistant:

Oop MethodSemanticAnalysis::visitBlockExpression(BlockExpression *node)
{
    auto argumentList = node->getArgumentList();

    if(node->isInlined())
    {
        if(argumentList)
        {
            auto &arguments = argumentList->getArguments();
            auto argumentCount = arguments.size();

            // Create the arguments scope.
            auto argumentScope = std::make_shared<LocalScope> (currentScope);
            for(size_t i = 0; i < argumentCount; ++i)
            {
                auto &arg = arguments[i];
                auto res = argumentScope->addArgument(arg->getSymbolOop(), localContext);
                if(!res)
                    error(arg, "the argument has the same name as another argument.");
                node->addInlineArgument(res);
                localVariables.push_back(res);
            }

            pushScope(argumentScope);
        }

        // Visit the method body
        node->getBody()->acceptVisitor(this);

        if(argumentList)
            popScope();
        return Oop();
    }

    // Store the local context.
    auto oldLocalContext = localContext;
    localContext = node;
    FunctionalNode::LocalVariables oldLocalVariables;
    oldLocalVariables.swap(localVariables);

    // Process the arguments
	if(argumentList)
	{
		auto &arguments = argumentList->getArguments();
        auto argumentCount = arguments.size();

		// Create the arguments scope.
		auto argumentScope = std::make_shared<LocalScope> (currentScope);
		for(size_t i = 0; i < argumentCount; ++i)
		{
			auto &arg = arguments[i];
			auto res = argumentScope->addArgument(arg->getSymbolOop(), localContext);
			if(!res)
				error(arg, "the argument has the same name as another argument.");
            localVariables.push_back(res);
		}

		pushScope(argumentScope);
	}

    // Visit the method body
	node->getBody()->acceptVisitor(this);

	if(argumentList)
		popScope();

    // Store the block local variables.
    node->setLocalVariables(localVariables);

    // Restore the local context.
    localContext = oldLocalContext;
    oldLocalVariables.swap(localVariables);

    return Oop();
}